

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio_json_parser.h
# Opt level: O1

size_t fio_json_parse(json_parser_s *parser,char *buffer,size_t length)

{
  ulong *puVar1;
  json_parser_s jVar2;
  double num;
  bool bVar3;
  byte bVar4;
  json_parser_s jVar5;
  byte *pbVar6;
  ulong *puVar7;
  void *pvVar8;
  json_parser_s jVar9;
  int *piVar10;
  undefined4 uVar11;
  uint8_t *alignment;
  ulong uVar12;
  fiobj_json_parser_s *pr;
  ulong *puVar13;
  FIOBJ o;
  int iVar14;
  ulong *puVar15;
  ulong *puVar16;
  ulong uVar17;
  ulong *puVar18;
  uint8_t *tmp;
  ulong *local_60;
  char *local_58;
  json_parser_s local_50;
  json_parser_s *local_48;
  ulong *local_40;
  json_parser_s local_38;
  
  if (buffer == (char *)0x0 || length == 0) {
LAB_0015f5da:
    puVar13 = (ulong *)0x0;
switchD_0015f3e4_caseD_4:
    return (size_t)puVar13;
  }
  puVar18 = (ulong *)(buffer + length);
  local_48 = parser + 4;
  local_40 = (ulong *)((ulong)puVar18 & 0xfffffffffffffff8);
  puVar7 = (ulong *)buffer;
LAB_0015eb19:
  while ((puVar7 < puVar18 && (""[(byte)*puVar7] != '\0'))) {
    puVar7 = (ulong *)((long)puVar7 + 1);
  }
  if (puVar7 == puVar18) goto switchD_0015f3e4_caseD_6;
  bVar4 = (byte)*puVar7;
  puVar13 = puVar7;
  if (bVar4 < 0x5d) {
    switch(bVar4) {
    case 0x22:
      bVar3 = true;
      puVar7 = (ulong *)((long)puVar7 + 1);
      for (puVar15 = puVar7; puVar15 < puVar18; puVar15 = (ulong *)((long)puVar15 + 2)) {
        if (""[(byte)*puVar15] == '\0') {
          puVar1 = (ulong *)(((ulong)puVar15 & 0xfffffffffffffff8) + 8);
          puVar16 = puVar15;
          if (puVar1 < puVar18) {
            if (puVar15 < puVar1 && puVar1 <= puVar18) {
              pbVar6 = (byte *)((long)puVar15 + (-8 - ((ulong)puVar15 & 0xfffffffffffffff8)));
              do {
                if (""[(byte)*puVar15] != '\0') goto LAB_0015f02d;
                puVar15 = (ulong *)((long)puVar15 + 1);
                pbVar6 = pbVar6 + 1;
                puVar16 = puVar1;
              } while (pbVar6 != (byte *)0x0);
            }
            while ((puVar16 < local_40 &&
                   (uVar12 = *puVar16 ^ 0xdddddddddddddddd, uVar17 = *puVar16 ^ 0xa3a3a3a3a3a3a3a3,
                   (uVar17 & 0x8080808080808080 & (uVar17 & 0x7f7f7f7f7f7f7f7f) + 0x101010101010101)
                   == 0 && (uVar12 & 0x8080808080808080 &
                           (uVar12 & 0x7f7f7f7f7f7f7f7f) + 0x101010101010101) == 0))) {
              puVar16 = puVar16 + 1;
            }
          }
          puVar15 = puVar16;
          if ((ulong *)((long)puVar16 + 4) <= puVar18) {
            if (""[(byte)*puVar16] == '\0') {
              if (""[*(byte *)((long)puVar16 + 1)] == '\0') {
                if (""[*(byte *)((long)puVar16 + 2)] == '\0') {
                  puVar15 = (ulong *)((long)puVar16 + 4);
                  if (""[*(byte *)((long)puVar16 + 3)] == '\0') goto LAB_0015f10b;
                  puVar15 = (ulong *)((long)puVar16 + 3);
                }
                else {
                  puVar15 = (ulong *)((long)puVar16 + 2);
                }
              }
              else {
                puVar15 = (ulong *)((long)puVar16 + 1);
              }
            }
            goto LAB_0015f02d;
          }
LAB_0015f10b:
          if (puVar15 < puVar18) {
            do {
              if (""[(byte)*puVar15] != '\0') goto LAB_0015f02d;
              puVar15 = (ulong *)((long)puVar15 + 1);
            } while (puVar15 != puVar18);
          }
        }
        else {
LAB_0015f02d:
          if ((byte)*puVar15 == 0x22) {
            bVar3 = false;
            break;
          }
        }
      }
      uVar11 = 6;
      local_58 = buffer;
      if (!bVar3) {
        if (parser->key == '\0') {
          fio_json_on_string(parser,puVar7,(long)puVar15 - (long)puVar7);
          puVar13 = (ulong *)((long)puVar15 + 1);
          uVar11 = 7;
        }
        else {
          puVar1 = (ulong *)((long)puVar15 + 1);
          do {
            puVar16 = puVar1;
            if (puVar18 <= puVar16) goto LAB_0015f3c5;
            puVar1 = (ulong *)((long)puVar16 + 1);
          } while (""[(byte)*puVar16] != '\0');
          if ((puVar16 < puVar18) && (uVar11 = 10, (byte)*puVar16 == 0x3a)) {
            fio_json_on_string(parser,puVar7,(long)puVar15 - (long)puVar7);
            parser->key = '\0';
            uVar11 = 3;
            puVar13 = (ulong *)((long)puVar16 + 1);
          }
        }
      }
LAB_0015f3c5:
      puVar7 = puVar13;
      buffer = local_58;
      switch(uVar11) {
      case 3:
        goto switchD_0015f3e4_caseD_3;
      default:
        goto switchD_0015f3e4_caseD_4;
      case 6:
        goto switchD_0015f3e4_caseD_6;
      case 7:
        goto switchD_0015f3e4_caseD_7;
      case 10:
        break;
      }
    case 0x23:
switchD_0015eb5e_caseD_23:
      pvVar8 = memchr(puVar7,10,(long)puVar18 - (long)puVar7);
      puVar13 = (ulong *)((long)pvVar8 + 1);
      if (pvVar8 != (void *)0x0) goto switchD_0015f3e4_caseD_3;
      goto switchD_0015f3e4_caseD_6;
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x3a:
    case 0x3b:
    case 0x3c:
    case 0x3d:
    case 0x3e:
    case 0x3f:
    case 0x40:
    case 0x41:
    case 0x42:
    case 0x43:
    case 0x44:
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x4a:
    case 0x4b:
    case 0x4c:
    case 0x4d:
      break;
    case 0x2d:
    case 0x2e:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x45:
    case 0x49:
switchD_0015eb5e_caseD_2d:
      local_60 = puVar7;
      uVar17 = fio_atol((char **)&local_60);
      iVar14 = 6;
      if (local_60 <= puVar18) {
        if ((local_60 == (ulong *)0x0) || (""[(byte)*local_60] != '\0')) {
          local_60 = puVar7;
          num = fio_atof((char **)&local_60);
          if ((puVar18 < local_60) ||
             ((iVar14 = 10, local_60 == (ulong *)0x0 || (""[(byte)*local_60] != '\0'))))
          goto LAB_0015ebbc;
          jVar5 = (json_parser_s)fiobj_float_new(num);
          jVar9 = parser[2];
          if (jVar9 == (json_parser_s)0x0) {
            parser[2] = jVar5;
          }
          else {
            if ((char)parser[8].dict == '\0') goto LAB_0015f25c;
            if (parser[1] == (json_parser_s)0x0) {
              parser[1] = jVar5;
            }
            else {
              fiobj_hash_set((FIOBJ)jVar9,(FIOBJ)parser[1],(FIOBJ)jVar5);
              fiobj_free((FIOBJ)parser[1]);
              parser[1].dict = 0;
              parser[1].depth = '\0';
              parser[1].key = '\0';
              *(undefined2 *)&parser[1].field_0x6 = 0;
            }
          }
        }
        else {
          if ((long)(uVar17 + 0x4000000000000000) < 0) {
            jVar5 = (json_parser_s)fiobj_num_new_bignum(uVar17);
          }
          else {
            jVar5 = (json_parser_s)((uVar17 * 2 | uVar17 & 0x8000000000000000) + 1);
          }
          jVar9 = parser[2];
          if (jVar9 == (json_parser_s)0x0) {
            parser[2] = jVar5;
          }
          else if ((char)parser[8].dict == '\0') {
LAB_0015f25c:
            fiobj_ary_push((FIOBJ)jVar9,(FIOBJ)jVar5);
          }
          else if (parser[1] == (json_parser_s)0x0) {
            parser[1] = jVar5;
          }
          else {
            fiobj_hash_set((FIOBJ)jVar9,(FIOBJ)parser[1],(FIOBJ)jVar5);
            fiobj_free((FIOBJ)parser[1]);
            parser[1].dict = 0;
            parser[1].depth = '\0';
            parser[1].key = '\0';
            *(undefined2 *)&parser[1].field_0x6 = 0;
          }
        }
        iVar14 = 7;
        puVar13 = local_60;
      }
LAB_0015ebbc:
      if (iVar14 == 7) goto switchD_0015f3e4_caseD_7;
      puVar7 = puVar13;
      if (iVar14 == 6) goto switchD_0015f3e4_caseD_6;
      if (iVar14 != 10) {
        return (size_t)puVar13;
      }
      break;
    case 0x2f:
      if (*(byte *)((long)puVar7 + 1) == 0x2f) goto switchD_0015eb5e_caseD_23;
      if (*(byte *)((long)puVar7 + 1) == 0x2a) {
        if ((ulong *)((long)puVar7 + 4) <= puVar18) {
          pbVar6 = (byte *)((long)puVar7 + 3);
          do {
            pbVar6 = (byte *)memchr(pbVar6,0x2f,(long)puVar18 - (long)pbVar6);
            if (pbVar6 == (byte *)0x0) {
              iVar14 = 6;
              goto LAB_0015f2f3;
            }
          } while (pbVar6[-1] != 0x2a);
          puVar7 = (ulong *)(pbVar6 + 1);
          iVar14 = 0;
LAB_0015f2f3:
          puVar13 = puVar7;
          if (iVar14 == 0) goto switchD_0015f3e4_caseD_3;
          if (iVar14 != 6) {
            return (size_t)puVar7;
          }
        }
        goto switchD_0015f3e4_caseD_6;
      }
      break;
    case 0x4e:
switchD_0015eb5e_caseD_4e:
      puVar15 = (ulong *)((long)puVar7 + 2);
      if (((puVar15 <= puVar18) && ((*puVar7 & 0xdf00) == 0x4100)) &&
         ((*(byte *)puVar15 & 0xdf) == 0x4e)) goto switchD_0015eb5e_caseD_2d;
      if (puVar18 <= (ulong *)((long)puVar7 + 3U)) goto switchD_0015f3e4_caseD_6;
      if (((*(byte *)((long)puVar7 + 1) == 0x75) && (*(byte *)puVar15 == 0x6c)) &&
         (*(byte *)((long)puVar7 + 3U) == 0x6c)) {
        fio_json_on_null(parser);
LAB_0015eddc:
        puVar13 = (ulong *)((long)puVar7 + 4);
        goto switchD_0015f3e4_caseD_7;
      }
      break;
    default:
      if (((bVar4 == 0x5b) && (parser->key == '\0')) &&
         ((bVar4 = parser->depth + 1, parser->depth = bVar4, bVar4 < 0x20 &&
          (parser->dict = parser->dict << 1, parser[3] == (json_parser_s)0x0)))) {
        jVar5 = (json_parser_s)fiobj_ary_new();
        jVar9 = parser[2];
        if (jVar9 == (json_parser_s)0x0) {
          parser[2] = jVar5;
          local_58 = buffer;
        }
        else if ((char)parser[8].dict == '\0') {
          local_58 = buffer;
          fiobj_ary_push((FIOBJ)jVar9,(FIOBJ)jVar5);
        }
        else if (parser[1] == (json_parser_s)0x0) {
          parser[1] = jVar5;
          local_58 = buffer;
        }
        else {
          local_58 = buffer;
          fiobj_hash_set((FIOBJ)jVar9,(FIOBJ)parser[1],(FIOBJ)jVar5);
          fiobj_free((FIOBJ)parser[1]);
          parser[1].dict = 0;
          parser[1].depth = '\0';
          parser[1].key = '\0';
          *(undefined2 *)&parser[1].field_0x6 = 0;
        }
        jVar9 = parser[2];
        jVar2 = parser[5];
        if (((ulong)parser[6] <= (ulong)jVar2) && ((ulong)parser[6] <= (long)jVar2 + 5U)) {
          uVar17 = (long)jVar2 + 5U & 0xfffffffffffffffe;
          local_50 = jVar5;
          local_38 = jVar9;
          jVar9 = (json_parser_s)fio_realloc2((void *)parser[7],uVar17 * 8 + 0x10,(long)jVar2 << 3);
          parser[7] = jVar9;
          if (jVar9 == (json_parser_s)0x0) goto LAB_0015f5f8;
          parser[6] = (json_parser_s)(uVar17 + 2);
          jVar9 = local_38;
          jVar5 = local_50;
        }
        if (parser[4] == parser[5]) {
          local_48->dict = 0;
          local_48->depth = '\0';
          local_48->key = '\0';
          *(undefined2 *)&local_48->field_0x6 = 0;
          local_48[1].dict = 0;
          local_48[1].depth = '\0';
          local_48[1].key = '\0';
          *(undefined2 *)&local_48[1].field_0x6 = 0;
        }
        *(json_parser_s *)((long)parser[7] + (long)parser[5] * 8) = jVar9;
        parser[5] = (json_parser_s)((long)parser[5] + 1);
        parser[2] = jVar5;
        *(undefined1 *)&parser[8].dict = 0;
        puVar13 = (ulong *)((long)puVar7 + 1);
        buffer = local_58;
        goto switchD_0015f3e4_caseD_7;
      }
    }
  }
  else {
    switch(bVar4) {
    case 0x65:
    case 0x69:
      goto switchD_0015eb5e_caseD_2d;
    case 0x66:
      if ((ulong *)((long)puVar7 + 4U) < puVar18) {
        if (((*(byte *)((long)puVar7 + 1) == 0x61) && (*(byte *)((long)puVar7 + 2) == 0x6c)) &&
           ((*(byte *)((long)puVar7 + 3) == 0x73 && (*(byte *)((long)puVar7 + 4U) == 0x65)))) {
          jVar9 = parser[2];
          if (jVar9 == (json_parser_s)0x0) {
            parser[2].dict = 0x26;
            parser[2].depth = '\0';
            parser[2].key = '\0';
            *(undefined2 *)&parser[2].field_0x6 = 0;
          }
          else if ((char)parser[8].dict == '\0') {
            fiobj_ary_push((FIOBJ)jVar9,0x26);
          }
          else if (parser[1] == (json_parser_s)0x0) {
            parser[1].dict = 0x26;
            parser[1].depth = '\0';
            parser[1].key = '\0';
            *(undefined2 *)&parser[1].field_0x6 = 0;
          }
          else {
            fiobj_hash_set((FIOBJ)jVar9,(FIOBJ)parser[1],0x26);
            fiobj_free((FIOBJ)parser[1]);
            parser[1].dict = 0;
            parser[1].depth = '\0';
            parser[1].key = '\0';
            *(undefined2 *)&parser[1].field_0x6 = 0;
          }
          puVar13 = (ulong *)((long)puVar7 + 5);
          goto switchD_0015f3e4_caseD_7;
        }
        break;
      }
      goto switchD_0015f3e4_caseD_6;
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
      break;
    case 0x6e:
      goto switchD_0015eb5e_caseD_4e;
    default:
      switch(bVar4) {
      case 0x74:
        if (puVar18 <= (ulong *)((long)puVar7 + 3U)) goto switchD_0015f3e4_caseD_6;
        if (((*(byte *)((long)puVar7 + 1) == 0x72) && (*(byte *)((long)puVar7 + 2) == 0x75)) &&
           (*(byte *)((long)puVar7 + 3U) == 0x65)) {
          jVar9 = parser[2];
          if (jVar9 == (json_parser_s)0x0) {
            parser[2].dict = 0x16;
            parser[2].depth = '\0';
            parser[2].key = '\0';
            *(undefined2 *)&parser[2].field_0x6 = 0;
          }
          else if ((char)parser[8].dict == '\0') {
            fiobj_ary_push((FIOBJ)jVar9,0x16);
          }
          else if (parser[1] == (json_parser_s)0x0) {
            parser[1].dict = 0x16;
            parser[1].depth = '\0';
            parser[1].key = '\0';
            *(undefined2 *)&parser[1].field_0x6 = 0;
          }
          else {
            fiobj_hash_set((FIOBJ)jVar9,(FIOBJ)parser[1],0x16);
            fiobj_free((FIOBJ)parser[1]);
            parser[1].dict = 0;
            parser[1].depth = '\0';
            parser[1].key = '\0';
            *(undefined2 *)&parser[1].field_0x6 = 0;
          }
          goto LAB_0015eddc;
        }
        break;
      case 0x75:
      case 0x76:
      case 0x77:
      case 0x79:
      case 0x7a:
      case 0x7c:
        break;
      case 0x78:
        goto switchD_0015eb5e_caseD_2d;
      case 0x7b:
        if ((parser->key == '\0') &&
           (bVar4 = parser->depth + 1, parser->depth = bVar4, bVar4 < 0x20)) {
          parser->dict = parser->dict * 2 + 1;
          if (parser[3] == (json_parser_s)0x0) {
            local_58 = buffer;
            jVar5 = (json_parser_s)fiobj_hash_new();
            jVar9 = parser[2];
            if (jVar9 == (json_parser_s)0x0) {
              parser[2] = jVar5;
            }
            else if ((char)parser[8].dict == '\0') {
              fiobj_ary_push((FIOBJ)jVar9,(FIOBJ)jVar5);
            }
            else if (parser[1] == (json_parser_s)0x0) {
              parser[1] = jVar5;
            }
            else {
              fiobj_hash_set((FIOBJ)jVar9,(FIOBJ)parser[1],(FIOBJ)jVar5);
              fiobj_free((FIOBJ)parser[1]);
              parser[1].dict = 0;
              parser[1].depth = '\0';
              parser[1].key = '\0';
              *(undefined2 *)&parser[1].field_0x6 = 0;
            }
            jVar9 = parser[2];
            jVar2 = parser[5];
            if (((ulong)parser[6] <= (ulong)jVar2) && ((ulong)parser[6] <= (long)jVar2 + 5U)) {
              uVar17 = (long)jVar2 + 5U & 0xfffffffffffffffe;
              local_50 = jVar5;
              jVar5 = (json_parser_s)
                      fio_realloc2((void *)parser[7],uVar17 * 8 + 0x10,(long)jVar2 << 3);
              parser[7] = jVar5;
              if (jVar5 == (json_parser_s)0x0) goto LAB_0015f5f8;
              parser[6] = (json_parser_s)(uVar17 + 2);
              jVar5 = local_50;
            }
            if (parser[4] == parser[5]) {
              local_48->dict = 0;
              local_48->depth = '\0';
              local_48->key = '\0';
              *(undefined2 *)&local_48->field_0x6 = 0;
              local_48[1].dict = 0;
              local_48[1].depth = '\0';
              local_48[1].key = '\0';
              *(undefined2 *)&local_48[1].field_0x6 = 0;
            }
            *(json_parser_s *)((long)parser[7] + (long)parser[5] * 8) = jVar9;
            parser[5] = (json_parser_s)((long)parser[5] + 1);
            parser[2] = jVar5;
          }
          else {
            jVar9 = parser[2];
            jVar5 = parser[5];
            local_58 = buffer;
            if (((ulong)parser[6] <= (ulong)jVar5) && ((ulong)parser[6] <= (long)jVar5 + 5U)) {
              uVar17 = (long)jVar5 + 5U & 0xfffffffffffffffe;
              jVar5 = (json_parser_s)
                      fio_realloc2((void *)parser[7],uVar17 * 8 + 0x10,(long)jVar5 << 3);
              parser[7] = jVar5;
              if (jVar5 == (json_parser_s)0x0) {
LAB_0015f5f8:
                if (0 < FIO_LOG_LEVEL) {
                  FIO_LOG2STDERR(
                                "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:4920"
                                );
                }
                kill(0,2);
                piVar10 = __errno_location();
                exit(*piVar10);
              }
              parser[6] = (json_parser_s)(uVar17 + 2);
            }
            if (parser[4] == parser[5]) {
              local_48->dict = 0;
              local_48->depth = '\0';
              local_48->key = '\0';
              *(undefined2 *)&local_48->field_0x6 = 0;
              local_48[1].dict = 0;
              local_48[1].depth = '\0';
              local_48[1].key = '\0';
              *(undefined2 *)&local_48[1].field_0x6 = 0;
            }
            *(json_parser_s *)((long)parser[7] + (long)parser[5] * 8) = jVar9;
            parser[5] = (json_parser_s)((long)parser[5] + 1);
            parser[2] = parser[3];
            parser[3].dict = 0;
            parser[3].depth = '\0';
            parser[3].key = '\0';
            *(undefined2 *)&parser[3].field_0x6 = 0;
          }
          puVar13 = (ulong *)((long)puVar7 + 1);
          *(undefined1 *)&parser[8].dict = 1;
          buffer = local_58;
          goto switchD_0015f3e4_caseD_7;
        }
        break;
      case 0x7d:
        if ((parser->dict & 1) != 0) {
          if (parser->key == '\0') {
            fio_json_on_null(parser);
          }
          parser->depth = parser->depth + 0xff;
          parser->dict = parser->dict >> 1;
          if (parser[1] != (json_parser_s)0x0) {
            if (2 < FIO_LOG_LEVEL) {
              FIO_LOG2STDERR("WARNING: (JSON parsing) malformed JSON, ignoring dangling Hash key.");
            }
            fiobj_free((FIOBJ)parser[1]);
            parser[1].dict = 0;
            parser[1].depth = '\0';
            parser[1].key = '\0';
            *(undefined2 *)&parser[1].field_0x6 = 0;
          }
LAB_0015ee8e:
          parser[2].dict = 0;
          parser[2].depth = '\0';
          parser[2].key = '\0';
          *(undefined2 *)&parser[2].field_0x6 = 0;
          jVar9 = parser[5];
          if (jVar9 != parser[4]) {
            parser[5] = (json_parser_s)((long)jVar9 + -1);
            parser[2] = *(json_parser_s *)((long)parser[7] + -8 + (long)jVar9 * 8);
          }
          puVar13 = (ulong *)((long)puVar7 + 1);
          *(bool *)&parser[8].dict = (parser[2].dict & 7) == 4;
          goto switchD_0015f3e4_caseD_7;
        }
        break;
      default:
        if ((bVar4 == 0x5d) && ((parser->dict & 1) == 0)) {
          parser->depth = parser->depth + 0xff;
          parser->dict = parser->dict >> 1;
          goto LAB_0015ee8e;
        }
      }
    }
  }
  if (parser[5] == parser[4]) {
    o = 0;
  }
  else {
    o = *(FIOBJ *)((long)parser[7] + (long)parser[4] * 8);
  }
  fiobj_free(o);
  fiobj_free((FIOBJ)parser[1]);
  fio_free((void *)parser[7]);
  parser[6].dict = 0;
  parser[6].depth = '\0';
  parser[6].key = '\0';
  *(undefined2 *)&parser[6].field_0x6 = 0;
  parser[7].dict = 0;
  parser[7].depth = '\0';
  parser[7].key = '\0';
  *(undefined2 *)&parser[7].field_0x6 = 0;
  parser[4].dict = 0;
  parser[4].depth = '\0';
  parser[4].key = '\0';
  *(undefined2 *)&parser[4].field_0x6 = 0;
  parser[5].dict = 0;
  parser[5].depth = '\0';
  parser[5].key = '\0';
  *(undefined2 *)&parser[5].field_0x6 = 0;
  parser[2].dict = 0;
  parser[2].depth = '\0';
  parser[2].key = '\0';
  *(undefined2 *)&parser[2].field_0x6 = 0;
  parser[3].dict = 0;
  parser[3].depth = '\0';
  parser[3].key = '\0';
  *(undefined2 *)&parser[3].field_0x6 = 0;
  parser->dict = 0;
  parser->depth = '\0';
  parser->key = '\0';
  *(undefined2 *)&parser->field_0x6 = 0;
  parser[1].dict = 0;
  parser[1].depth = '\0';
  parser[1].key = '\0';
  *(undefined2 *)&parser[1].field_0x6 = 0;
  parser[8].dict = 0;
  parser[8].depth = '\0';
  parser[8].key = '\0';
  *(undefined2 *)&parser[8].field_0x6 = 0;
  goto LAB_0015f5da;
switchD_0015f3e4_caseD_7:
  puVar7 = puVar13;
  if (parser->depth == '\0') goto switchD_0015f3e4_caseD_6;
  parser->key = (byte)parser->dict & 1;
switchD_0015f3e4_caseD_3:
  puVar7 = puVar13;
  if (puVar18 <= puVar13) {
switchD_0015f3e4_caseD_6:
    return (long)puVar7 - (long)buffer;
  }
  goto LAB_0015eb19;
}

Assistant:

static size_t __attribute__((unused))
fio_json_parse(json_parser_s *parser, const char *buffer, size_t length) {
  if (!length || !buffer)
    return 0;
  uint8_t *pos = (uint8_t *)buffer;
  const uint8_t *limit = pos + length;
  do {
    while (pos < limit && JSON_SEPERATOR[*pos])
      ++pos;
    if (pos == limit)
      goto stop;
    switch (*pos) {
    case '"': {
      uint8_t *tmp = pos + 1;
      if (seek2eos(&tmp, limit) == 0)
        goto stop;
      if (parser->key) {
        uint8_t *key = tmp + 1;
        while (key < limit && JSON_SEPERATOR[*key])
          ++key;
        if (key >= limit)
          goto stop;
        if (*key != ':')
          goto error;
        ++pos;
        fio_json_on_string(parser, pos, (uintptr_t)(tmp - pos));
        pos = key + 1;
        parser->key = 0;
        continue; /* skip tests */
      } else {
        ++pos;
        fio_json_on_string(parser, pos, (uintptr_t)(tmp - pos));
        pos = tmp + 1;
      }
      break;
    }
    case '{':
      if (parser->key) {
#if DEBUG
        fprintf(stderr, "ERROR: JSON key can't be a Hash.\n");
#endif
        goto error;
      }
      ++parser->depth;
      if (parser->depth >= JSON_MAX_DEPTH)
        goto error;
      parser->dict = (parser->dict << 1) | 1;
      ++pos;
      if (fio_json_on_start_object(parser))
        goto error;
      break;
    case '}':
      if ((parser->dict & 1) == 0) {
#if DEBUG
        fprintf(stderr, "ERROR: JSON dictionary closure error.\n");
#endif
        goto error;
      }
      if (!parser->key) {
#if DEBUG
        fprintf(stderr, "ERROR: JSON dictionary closure missing key value.\n");
        goto error;
#endif
        fio_json_on_null(parser); /* append NULL and recuperate from error. */
      }
      --parser->depth;
      ++pos;
      parser->dict = (parser->dict >> 1);
      fio_json_on_end_object(parser);
      break;
    case '[':
      if (parser->key) {
#if DEBUG
        fprintf(stderr, "ERROR: JSON key can't be an array.\n");
#endif
        goto error;
      }
      ++parser->depth;
      if (parser->depth >= JSON_MAX_DEPTH)
        goto error;
      ++pos;
      parser->dict = (parser->dict << 1);
      if (fio_json_on_start_array(parser))
        goto error;
      break;
    case ']':
      if ((parser->dict & 1))
        goto error;
      --parser->depth;
      ++pos;
      parser->dict = (parser->dict >> 1);
      fio_json_on_end_array(parser);
      break;
    case 't':
      if (pos + 3 >= limit)
        goto stop;
      if (pos[1] == 'r' && pos[2] == 'u' && pos[3] == 'e')
        fio_json_on_true(parser);
      else
        goto error;
      pos += 4;
      break;
    case 'N': /* overflow */
    case 'n':
      if (pos + 2 <= limit && (pos[1] | 32) == 'a' && (pos[2] | 32) == 'n')
        goto numeral;
      if (pos + 3 >= limit)
        goto stop;
      if (pos[1] == 'u' && pos[2] == 'l' && pos[3] == 'l')
        fio_json_on_null(parser);
      else
        goto error;
      pos += 4;
      break;
    case 'f':
      if (pos + 4 >= limit)
        goto stop;
      if (pos + 4 < limit && pos[1] == 'a' && pos[2] == 'l' && pos[3] == 's' &&
          pos[4] == 'e')
        fio_json_on_false(parser);
      else
        goto error;
      pos += 5;
      break;
    case '-': /* overflow */
    case '0': /* overflow */
    case '1': /* overflow */
    case '2': /* overflow */
    case '3': /* overflow */
    case '4': /* overflow */
    case '5': /* overflow */
    case '6': /* overflow */
    case '7': /* overflow */
    case '8': /* overflow */
    case '9': /* overflow */
    case '.': /* overflow */
    case 'e': /* overflow */
    case 'E': /* overflow */
    case 'x': /* overflow */
    case 'i': /* overflow */
    case 'I': /* overflow */
    numeral : {
      uint8_t *tmp = pos;
      long long i = fio_atol((char **)&tmp);
      if (tmp > limit)
        goto stop;
      if (!tmp || JSON_NUMERAL[*tmp]) {
        tmp = pos;
        double f = fio_atof((char **)&tmp);
        if (tmp > limit)
          goto stop;
        if (!tmp || JSON_NUMERAL[*tmp])
          goto error;
        fio_json_on_float(parser, f);
        pos = tmp;
      } else {
        fio_json_on_number(parser, i);
        pos = tmp;
      }
      break;
    }
    case '#': /* Ruby style comment */
    {
      uint8_t *tmp = memchr(pos, '\n', (uintptr_t)(limit - pos));
      if (!tmp)
        goto stop;
      pos = tmp + 1;
      continue; /* skip tests */
      ;
    }
    case '/': /* C style / Javascript style comment */
      if (pos[1] == '*') {
        if (pos + 4 > limit)
          goto stop;
        uint8_t *tmp = pos + 3; /* avoid this: /*/
        do {
          tmp = memchr(tmp, '/', (uintptr_t)(limit - tmp));
        } while (tmp && tmp[-1] != '*');
        if (!tmp)
          goto stop;
        pos = tmp + 1;
      } else if (pos[1] == '/') {
        uint8_t *tmp = memchr(pos, '\n', (uintptr_t)(limit - pos));
        if (!tmp)
          goto stop;
        pos = tmp + 1;
      } else
        goto error;
      continue; /* skip tests */
      ;
    default:
      goto error;
    }
    if (parser->depth == 0) {
      fio_json_on_json(parser);
      goto stop;
    }
    parser->key = (parser->dict & 1);
  } while (pos < limit);
stop:
  return (size_t)((uintptr_t)pos - (uintptr_t)buffer);
error:
  fio_json_on_error(parser);
  return 0;
}